

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  uint uVar6;
  ulong uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 (*pauVar63) [16];
  uint uVar64;
  uint uVar65;
  long lVar66;
  Scene *pSVar67;
  ulong uVar68;
  ulong uVar69;
  long lVar70;
  ulong uVar71;
  undefined1 (*pauVar72) [16];
  ulong uVar73;
  ulong uVar74;
  float fVar75;
  undefined1 auVar77 [16];
  float fVar82;
  float fVar83;
  undefined1 auVar76 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  float fVar84;
  undefined1 auVar85 [16];
  float fVar90;
  float fVar91;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar92;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar105;
  float fVar106;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar108;
  float fVar109;
  float fVar111;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar107;
  float fVar110;
  float fVar112;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar119;
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar117 [32];
  float fVar121;
  float fVar125;
  undefined1 auVar118 [32];
  float fVar128;
  float fVar129;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  float fVar139;
  float fVar140;
  undefined1 auVar141 [32];
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar142 [64];
  float fVar155;
  float fVar156;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar160 [64];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  float fVar169;
  undefined1 auVar170 [32];
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar171 [64];
  float fVar178;
  float fVar179;
  undefined1 auVar180 [32];
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar181 [64];
  float fVar195;
  undefined1 auVar196 [32];
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar197 [64];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  float fVar206;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar207 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1540 [16];
  undefined1 (*local_1528) [16];
  long local_1520;
  ulong local_1518;
  RTCFilterFunctionNArguments local_1510;
  undefined1 local_14e0 [32];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  Scene *local_1460;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  undefined1 local_1430 [16];
  undefined1 local_1420 [16];
  undefined1 local_1410 [16];
  undefined1 local_1400 [16];
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [16];
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  RTCHitN local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined4 local_1330;
  undefined4 uStack_132c;
  undefined4 uStack_1328;
  undefined4 uStack_1324;
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  uint local_1300;
  uint uStack_12fc;
  uint uStack_12f8;
  uint uStack_12f4;
  uint uStack_12f0;
  uint uStack_12ec;
  uint uStack_12e8;
  uint uStack_12e4;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  float local_1160 [4];
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  undefined4 uStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar72 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_13b0._4_4_ = uVar2;
  local_13b0._0_4_ = uVar2;
  local_13b0._8_4_ = uVar2;
  local_13b0._12_4_ = uVar2;
  auVar138 = ZEXT1664(local_13b0);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_13c0._4_4_ = uVar2;
  local_13c0._0_4_ = uVar2;
  local_13c0._8_4_ = uVar2;
  local_13c0._12_4_ = uVar2;
  auVar142 = ZEXT1664(local_13c0);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_13d0._4_4_ = uVar2;
  local_13d0._0_4_ = uVar2;
  local_13d0._8_4_ = uVar2;
  local_13d0._12_4_ = uVar2;
  auVar160 = ZEXT1664(local_13d0);
  fVar84 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar90 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar76 = ZEXT416((uint)(fVar84 * 0.99999964));
  local_13e0 = vshufps_avx(auVar76,auVar76,0);
  auVar168 = ZEXT1664(local_13e0);
  auVar76 = ZEXT416((uint)(fVar90 * 0.99999964));
  local_13f0 = vshufps_avx(auVar76,auVar76,0);
  auVar171 = ZEXT1664(local_13f0);
  auVar76 = ZEXT416((uint)(fVar3 * 0.99999964));
  local_1400 = vshufps_avx(auVar76,auVar76,0);
  auVar181 = ZEXT1664(local_1400);
  auVar76 = ZEXT416((uint)(fVar84 * 1.0000004));
  local_1410 = vshufps_avx(auVar76,auVar76,0);
  auVar197 = ZEXT1664(local_1410);
  auVar76 = ZEXT416((uint)(fVar90 * 1.0000004));
  local_1420 = vshufps_avx(auVar76,auVar76,0);
  auVar205 = ZEXT1664(local_1420);
  auVar76 = ZEXT416((uint)(fVar3 * 1.0000004));
  local_1430 = vshufps_avx(auVar76,auVar76,0);
  auVar207 = ZEXT1664(local_1430);
  uVar69 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar71 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar68 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1518 = uVar69 ^ 0x10;
  iVar4 = (tray->tnear).field_0.i[k];
  local_14b0._4_4_ = iVar4;
  local_14b0._0_4_ = iVar4;
  local_14b0._8_4_ = iVar4;
  local_14b0._12_4_ = iVar4;
  auVar136 = ZEXT1664(local_14b0);
  iVar4 = (tray->tfar).field_0.i[k];
  auVar81 = ZEXT1664(CONCAT412(iVar4,CONCAT48(iVar4,CONCAT44(iVar4,iVar4))));
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  local_1528 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar117._8_4_ = 0x3f800000;
  auVar117._0_8_ = 0x3f8000003f800000;
  auVar117._12_4_ = 0x3f800000;
  auVar117._16_4_ = 0x3f800000;
  auVar117._20_4_ = 0x3f800000;
  auVar117._24_4_ = 0x3f800000;
  auVar117._28_4_ = 0x3f800000;
  auVar86._8_4_ = 0xbf800000;
  auVar86._0_8_ = 0xbf800000bf800000;
  auVar86._12_4_ = 0xbf800000;
  auVar86._16_4_ = 0xbf800000;
  auVar86._20_4_ = 0xbf800000;
  auVar86._24_4_ = 0xbf800000;
  auVar86._28_4_ = 0xbf800000;
  local_1120 = vblendvps_avx(auVar117,auVar86,local_1100);
LAB_00efed45:
  do {
    do {
      if (pauVar72 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar63 = pauVar72 + -1;
      pauVar72 = pauVar72 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar63 + 8));
    uVar74 = *(ulong *)*pauVar72;
    while ((uVar74 & 8) == 0) {
      auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar74 + 0x20 + uVar69),auVar138._0_16_);
      auVar85._0_4_ = auVar168._0_4_ * auVar76._0_4_;
      auVar85._4_4_ = auVar168._4_4_ * auVar76._4_4_;
      auVar85._8_4_ = auVar168._8_4_ * auVar76._8_4_;
      auVar85._12_4_ = auVar168._12_4_ * auVar76._12_4_;
      auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar74 + 0x20 + uVar71),auVar142._0_16_);
      auVar96._0_4_ = auVar171._0_4_ * auVar76._0_4_;
      auVar96._4_4_ = auVar171._4_4_ * auVar76._4_4_;
      auVar96._8_4_ = auVar171._8_4_ * auVar76._8_4_;
      auVar96._12_4_ = auVar171._12_4_ * auVar76._12_4_;
      auVar76 = vmaxps_avx(auVar85,auVar96);
      auVar85 = vsubps_avx(*(undefined1 (*) [16])(uVar74 + 0x20 + uVar68),auVar160._0_16_);
      auVar97._0_4_ = auVar181._0_4_ * auVar85._0_4_;
      auVar97._4_4_ = auVar181._4_4_ * auVar85._4_4_;
      auVar97._8_4_ = auVar181._8_4_ * auVar85._8_4_;
      auVar97._12_4_ = auVar181._12_4_ * auVar85._12_4_;
      auVar85 = vmaxps_avx(auVar97,auVar136._0_16_);
      auVar85 = vmaxps_avx(auVar76,auVar85);
      auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar74 + 0x20 + local_1518),auVar138._0_16_);
      auVar98._0_4_ = auVar197._0_4_ * auVar76._0_4_;
      auVar98._4_4_ = auVar197._4_4_ * auVar76._4_4_;
      auVar98._8_4_ = auVar197._8_4_ * auVar76._8_4_;
      auVar98._12_4_ = auVar197._12_4_ * auVar76._12_4_;
      auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar74 + 0x20 + (uVar71 ^ 0x10)),auVar142._0_16_);
      auVar114._0_4_ = auVar205._0_4_ * auVar76._0_4_;
      auVar114._4_4_ = auVar205._4_4_ * auVar76._4_4_;
      auVar114._8_4_ = auVar205._8_4_ * auVar76._8_4_;
      auVar114._12_4_ = auVar205._12_4_ * auVar76._12_4_;
      auVar76 = vminps_avx(auVar98,auVar114);
      auVar96 = vsubps_avx(*(undefined1 (*) [16])(uVar74 + 0x20 + (uVar68 ^ 0x10)),auVar160._0_16_);
      auVar115._0_4_ = auVar207._0_4_ * auVar96._0_4_;
      auVar115._4_4_ = auVar207._4_4_ * auVar96._4_4_;
      auVar115._8_4_ = auVar207._8_4_ * auVar96._8_4_;
      auVar115._12_4_ = auVar207._12_4_ * auVar96._12_4_;
      auVar96 = vminps_avx(auVar115,auVar81._0_16_);
      auVar76 = vminps_avx(auVar76,auVar96);
      auVar76 = vcmpps_avx(auVar85,auVar76,2);
      uVar64 = vmovmskps_avx(auVar76);
      local_12e0._0_16_ = auVar85;
      if (uVar64 == 0) goto LAB_00efed45;
      uVar64 = uVar64 & 0xff;
      uVar73 = uVar74 & 0xfffffffffffffff0;
      lVar70 = 0;
      if (uVar64 != 0) {
        for (; (uVar64 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
        }
      }
      uVar74 = *(ulong *)(uVar73 + lVar70 * 8);
      uVar64 = uVar64 - 1 & uVar64;
      if (uVar64 != 0) {
        uVar65 = *(uint *)(local_12e0 + lVar70 * 4);
        lVar70 = 0;
        if (uVar64 != 0) {
          for (; (uVar64 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
          }
        }
        uVar7 = *(ulong *)(uVar73 + lVar70 * 8);
        uVar6 = *(uint *)(local_12e0 + lVar70 * 4);
        uVar64 = uVar64 - 1 & uVar64;
        if (uVar64 == 0) {
          if (uVar65 < uVar6) {
            *(ulong *)*pauVar72 = uVar7;
            *(uint *)(*pauVar72 + 8) = uVar6;
            pauVar72 = pauVar72 + 1;
          }
          else {
            *(ulong *)*pauVar72 = uVar74;
            *(uint *)(*pauVar72 + 8) = uVar65;
            pauVar72 = pauVar72 + 1;
            uVar74 = uVar7;
          }
        }
        else {
          auVar76._8_8_ = 0;
          auVar76._0_8_ = uVar74;
          auVar76 = vpunpcklqdq_avx(auVar76,ZEXT416(uVar65));
          auVar99._8_8_ = 0;
          auVar99._0_8_ = uVar7;
          auVar85 = vpunpcklqdq_avx(auVar99,ZEXT416(uVar6));
          lVar70 = 0;
          if (uVar64 != 0) {
            for (; (uVar64 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
            }
          }
          auVar116._8_8_ = 0;
          auVar116._0_8_ = *(ulong *)(uVar73 + lVar70 * 8);
          auVar97 = vpunpcklqdq_avx(auVar116,ZEXT416(*(uint *)(local_12e0 + lVar70 * 4)));
          auVar96 = vpcmpgtd_avx(auVar85,auVar76);
          uVar64 = uVar64 - 1 & uVar64;
          if (uVar64 == 0) {
            auVar98 = vpshufd_avx(auVar96,0xaa);
            auVar96 = vblendvps_avx(auVar85,auVar76,auVar98);
            auVar76 = vblendvps_avx(auVar76,auVar85,auVar98);
            auVar85 = vpcmpgtd_avx(auVar97,auVar96);
            auVar98 = vpshufd_avx(auVar85,0xaa);
            auVar85 = vblendvps_avx(auVar97,auVar96,auVar98);
            auVar96 = vblendvps_avx(auVar96,auVar97,auVar98);
            auVar97 = vpcmpgtd_avx(auVar96,auVar76);
            auVar98 = vpshufd_avx(auVar97,0xaa);
            auVar97 = vblendvps_avx(auVar96,auVar76,auVar98);
            auVar76 = vblendvps_avx(auVar76,auVar96,auVar98);
            *pauVar72 = auVar76;
            pauVar72[1] = auVar97;
            uVar74 = auVar85._0_8_;
            pauVar72 = pauVar72 + 2;
          }
          else {
            lVar70 = 0;
            if (uVar64 != 0) {
              for (; (uVar64 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
              }
            }
            auVar130._8_8_ = 0;
            auVar130._0_8_ = *(ulong *)(uVar73 + lVar70 * 8);
            auVar114 = vpunpcklqdq_avx(auVar130,ZEXT416(*(uint *)(local_12e0 + lVar70 * 4)));
            auVar98 = vpshufd_avx(auVar96,0xaa);
            auVar96 = vblendvps_avx(auVar85,auVar76,auVar98);
            auVar76 = vblendvps_avx(auVar76,auVar85,auVar98);
            auVar85 = vpcmpgtd_avx(auVar114,auVar97);
            auVar98 = vpshufd_avx(auVar85,0xaa);
            auVar85 = vblendvps_avx(auVar114,auVar97,auVar98);
            auVar97 = vblendvps_avx(auVar97,auVar114,auVar98);
            auVar98 = vpcmpgtd_avx(auVar97,auVar76);
            auVar114 = vpshufd_avx(auVar98,0xaa);
            auVar98 = vblendvps_avx(auVar97,auVar76,auVar114);
            auVar76 = vblendvps_avx(auVar76,auVar97,auVar114);
            auVar97 = vpcmpgtd_avx(auVar85,auVar96);
            auVar114 = vpshufd_avx(auVar97,0xaa);
            auVar97 = vblendvps_avx(auVar85,auVar96,auVar114);
            auVar85 = vblendvps_avx(auVar96,auVar85,auVar114);
            auVar96 = vpcmpgtd_avx(auVar98,auVar85);
            auVar114 = vpshufd_avx(auVar96,0xaa);
            auVar96 = vblendvps_avx(auVar98,auVar85,auVar114);
            auVar85 = vblendvps_avx(auVar85,auVar98,auVar114);
            *pauVar72 = auVar76;
            pauVar72[1] = auVar85;
            pauVar72[2] = auVar96;
            auVar136 = ZEXT1664(local_14b0);
            uVar74 = auVar97._0_8_;
            pauVar72 = pauVar72 + 3;
          }
        }
      }
    }
    local_1520 = (ulong)((uint)uVar74 & 0xf) - 8;
    uVar74 = uVar74 & 0xfffffffffffffff0;
    for (lVar70 = 0; lVar70 != local_1520; lVar70 = lVar70 + 1) {
      lVar66 = lVar70 * 0xe0;
      lVar1 = uVar74 + 0xd0 + lVar66;
      local_13a0 = *(undefined8 *)(lVar1 + 0x10);
      uStack_1398 = *(undefined8 *)(lVar1 + 0x18);
      lVar1 = uVar74 + 0xc0 + lVar66;
      local_fc0 = *(undefined8 *)(lVar1 + 0x10);
      uStack_fb8 = *(undefined8 *)(lVar1 + 0x18);
      uStack_fb0 = local_fc0;
      uStack_fa8 = uStack_fb8;
      uStack_1390 = local_13a0;
      uStack_1388 = uStack_1398;
      auVar78._16_16_ = *(undefined1 (*) [16])(uVar74 + 0x60 + lVar66);
      auVar78._0_16_ = *(undefined1 (*) [16])(uVar74 + lVar66);
      auVar87._16_16_ = *(undefined1 (*) [16])(uVar74 + 0x70 + lVar66);
      auVar87._0_16_ = *(undefined1 (*) [16])(uVar74 + 0x10 + lVar66);
      auVar100._16_16_ = *(undefined1 (*) [16])(uVar74 + 0x80 + lVar66);
      auVar100._0_16_ = *(undefined1 (*) [16])(uVar74 + 0x20 + lVar66);
      auVar76 = *(undefined1 (*) [16])(uVar74 + 0x30 + lVar66);
      auVar131._16_16_ = auVar76;
      auVar131._0_16_ = auVar76;
      auVar76 = *(undefined1 (*) [16])(uVar74 + 0x40 + lVar66);
      auVar134._16_16_ = auVar76;
      auVar134._0_16_ = auVar76;
      auVar76 = *(undefined1 (*) [16])(uVar74 + 0x50 + lVar66);
      auVar137._16_16_ = auVar76;
      auVar137._0_16_ = auVar76;
      auVar76 = *(undefined1 (*) [16])(uVar74 + 0x90 + lVar66);
      auVar141._16_16_ = auVar76;
      auVar141._0_16_ = auVar76;
      auVar76 = *(undefined1 (*) [16])(uVar74 + 0xa0 + lVar66);
      auVar157._16_16_ = auVar76;
      auVar157._0_16_ = auVar76;
      auVar85 = *(undefined1 (*) [16])(uVar74 + 0xb0 + lVar66);
      auVar167._16_16_ = auVar85;
      auVar167._0_16_ = auVar85;
      uVar2 = *(undefined4 *)(ray + k * 4);
      auVar170._4_4_ = uVar2;
      auVar170._0_4_ = uVar2;
      auVar170._8_4_ = uVar2;
      auVar170._12_4_ = uVar2;
      auVar170._16_4_ = uVar2;
      auVar170._20_4_ = uVar2;
      auVar170._24_4_ = uVar2;
      auVar170._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar180._4_4_ = uVar2;
      auVar180._0_4_ = uVar2;
      auVar180._8_4_ = uVar2;
      auVar180._12_4_ = uVar2;
      auVar180._16_4_ = uVar2;
      auVar180._20_4_ = uVar2;
      auVar180._24_4_ = uVar2;
      auVar180._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar204._4_4_ = uVar2;
      auVar204._0_4_ = uVar2;
      auVar204._8_4_ = uVar2;
      auVar204._12_4_ = uVar2;
      auVar204._16_4_ = uVar2;
      auVar204._20_4_ = uVar2;
      auVar204._24_4_ = uVar2;
      auVar204._28_4_ = uVar2;
      auVar86 = vsubps_avx(auVar78,auVar170);
      auVar117 = vsubps_avx(auVar87,auVar180);
      local_fe0 = vsubps_avx(auVar100,auVar204);
      auVar28 = vsubps_avx(auVar131,auVar170);
      auVar29 = vsubps_avx(auVar134,auVar180);
      auVar30 = vsubps_avx(auVar137,auVar204);
      auVar31 = vsubps_avx(auVar141,auVar170);
      auVar32 = vsubps_avx(auVar157,auVar180);
      auVar33 = vsubps_avx(auVar167,auVar204);
      local_1000 = vsubps_avx(auVar31,auVar86);
      local_1020 = vsubps_avx(auVar32,auVar117);
      local_1040 = vsubps_avx(auVar33,local_fe0);
      fVar3 = auVar117._0_4_;
      fVar84 = auVar32._0_4_ + fVar3;
      fVar12 = auVar117._4_4_;
      fVar90 = auVar32._4_4_ + fVar12;
      fVar106 = auVar117._8_4_;
      fVar91 = auVar32._8_4_ + fVar106;
      fVar110 = auVar117._12_4_;
      fVar92 = auVar32._12_4_ + fVar110;
      fVar15 = auVar117._16_4_;
      fVar93 = auVar32._16_4_ + fVar15;
      fVar18 = auVar117._20_4_;
      fVar94 = auVar32._20_4_ + fVar18;
      fVar21 = auVar117._24_4_;
      fVar95 = auVar32._24_4_ + fVar21;
      fVar10 = local_fe0._0_4_;
      fVar139 = auVar33._0_4_ + fVar10;
      fVar13 = local_fe0._4_4_;
      fVar143 = auVar33._4_4_ + fVar13;
      fVar107 = local_fe0._8_4_;
      fVar145 = auVar33._8_4_ + fVar107;
      fVar112 = local_fe0._12_4_;
      fVar147 = auVar33._12_4_ + fVar112;
      fVar16 = local_fe0._16_4_;
      fVar149 = auVar33._16_4_ + fVar16;
      fVar19 = local_fe0._20_4_;
      fVar151 = auVar33._20_4_ + fVar19;
      fVar22 = local_fe0._24_4_;
      fVar153 = auVar33._24_4_ + fVar22;
      fVar156 = local_fe0._28_4_;
      fVar24 = local_1040._0_4_;
      fVar25 = local_1040._4_4_;
      auVar34._4_4_ = fVar90 * fVar25;
      auVar34._0_4_ = fVar84 * fVar24;
      fVar26 = local_1040._8_4_;
      auVar34._8_4_ = fVar91 * fVar26;
      fVar27 = local_1040._12_4_;
      auVar34._12_4_ = fVar92 * fVar27;
      fVar75 = local_1040._16_4_;
      auVar34._16_4_ = fVar93 * fVar75;
      fVar82 = local_1040._20_4_;
      auVar34._20_4_ = fVar94 * fVar82;
      fVar83 = local_1040._24_4_;
      auVar34._24_4_ = fVar95 * fVar83;
      auVar34._28_4_ = auVar76._12_4_;
      fVar178 = local_1020._0_4_;
      fVar182 = local_1020._4_4_;
      auVar35._4_4_ = fVar182 * fVar143;
      auVar35._0_4_ = fVar178 * fVar139;
      fVar184 = local_1020._8_4_;
      auVar35._8_4_ = fVar184 * fVar145;
      fVar186 = local_1020._12_4_;
      auVar35._12_4_ = fVar186 * fVar147;
      fVar188 = local_1020._16_4_;
      auVar35._16_4_ = fVar188 * fVar149;
      fVar190 = local_1020._20_4_;
      auVar35._20_4_ = fVar190 * fVar151;
      fVar192 = local_1020._24_4_;
      auVar35._24_4_ = fVar192 * fVar153;
      auVar35._28_4_ = auVar85._12_4_;
      auVar34 = vsubps_avx(auVar35,auVar34);
      fVar11 = auVar86._0_4_;
      fVar155 = auVar31._0_4_ + fVar11;
      fVar105 = auVar86._4_4_;
      fVar161 = auVar31._4_4_ + fVar105;
      fVar108 = auVar86._8_4_;
      fVar162 = auVar31._8_4_ + fVar108;
      fVar14 = auVar86._12_4_;
      fVar163 = auVar31._12_4_ + fVar14;
      fVar17 = auVar86._16_4_;
      fVar164 = auVar31._16_4_ + fVar17;
      fVar20 = auVar86._20_4_;
      fVar165 = auVar31._20_4_ + fVar20;
      fVar23 = auVar86._24_4_;
      fVar166 = auVar31._24_4_ + fVar23;
      fVar169 = local_1000._0_4_;
      fVar172 = local_1000._4_4_;
      auVar36._4_4_ = fVar172 * fVar143;
      auVar36._0_4_ = fVar169 * fVar139;
      fVar173 = local_1000._8_4_;
      auVar36._8_4_ = fVar173 * fVar145;
      fVar174 = local_1000._12_4_;
      auVar36._12_4_ = fVar174 * fVar147;
      fVar175 = local_1000._16_4_;
      auVar36._16_4_ = fVar175 * fVar149;
      fVar176 = local_1000._20_4_;
      auVar36._20_4_ = fVar176 * fVar151;
      fVar177 = local_1000._24_4_;
      auVar36._24_4_ = fVar177 * fVar153;
      auVar36._28_4_ = auVar33._28_4_ + fVar156;
      auVar78 = local_1040;
      auVar37._4_4_ = fVar161 * fVar25;
      auVar37._0_4_ = fVar155 * fVar24;
      auVar37._8_4_ = fVar162 * fVar26;
      auVar37._12_4_ = fVar163 * fVar27;
      auVar37._16_4_ = fVar164 * fVar75;
      auVar37._20_4_ = fVar165 * fVar82;
      auVar37._24_4_ = fVar166 * fVar83;
      auVar37._28_4_ = auVar85._12_4_;
      auVar35 = vsubps_avx(auVar37,auVar36);
      auVar37 = local_1020;
      auVar38._4_4_ = fVar161 * fVar182;
      auVar38._0_4_ = fVar155 * fVar178;
      auVar38._8_4_ = fVar162 * fVar184;
      auVar38._12_4_ = fVar163 * fVar186;
      auVar38._16_4_ = fVar164 * fVar188;
      auVar38._20_4_ = fVar165 * fVar190;
      auVar38._24_4_ = fVar166 * fVar192;
      auVar38._28_4_ = auVar31._28_4_ + auVar86._28_4_;
      auVar39._4_4_ = fVar172 * fVar90;
      auVar39._0_4_ = fVar169 * fVar84;
      auVar39._8_4_ = fVar173 * fVar91;
      auVar39._12_4_ = fVar174 * fVar92;
      auVar39._16_4_ = fVar175 * fVar93;
      auVar39._20_4_ = fVar176 * fVar94;
      auVar39._24_4_ = fVar177 * fVar95;
      auVar39._28_4_ = auVar32._28_4_ + auVar117._28_4_;
      auVar36 = vsubps_avx(auVar39,auVar38);
      fVar84 = *(float *)(ray + k * 4 + 0x50);
      fVar90 = *(float *)(ray + k * 4 + 0x60);
      fStack_1458 = *(float *)(ray + k * 4 + 0x40);
      local_1080._0_4_ =
           auVar34._0_4_ * fStack_1458 + fVar84 * auVar35._0_4_ + auVar36._0_4_ * fVar90;
      local_1080._4_4_ =
           auVar34._4_4_ * fStack_1458 + fVar84 * auVar35._4_4_ + auVar36._4_4_ * fVar90;
      local_1080._8_4_ =
           auVar34._8_4_ * fStack_1458 + fVar84 * auVar35._8_4_ + auVar36._8_4_ * fVar90;
      local_1080._12_4_ =
           auVar34._12_4_ * fStack_1458 + fVar84 * auVar35._12_4_ + auVar36._12_4_ * fVar90;
      local_1080._16_4_ =
           auVar34._16_4_ * fStack_1458 + fVar84 * auVar35._16_4_ + auVar36._16_4_ * fVar90;
      local_1080._20_4_ =
           auVar34._20_4_ * fStack_1458 + fVar84 * auVar35._20_4_ + auVar36._20_4_ * fVar90;
      local_1080._24_4_ =
           auVar34._24_4_ * fStack_1458 + fVar84 * auVar35._24_4_ + auVar36._24_4_ * fVar90;
      local_1080._28_4_ = auVar35._28_4_ + auVar35._28_4_ + auVar36._28_4_;
      local_1060 = vsubps_avx(auVar117,auVar29);
      auVar35 = vsubps_avx(local_fe0,auVar30);
      fVar93 = fVar3 + auVar29._0_4_;
      fVar94 = fVar12 + auVar29._4_4_;
      fVar95 = fVar106 + auVar29._8_4_;
      fVar139 = fVar110 + auVar29._12_4_;
      fVar143 = fVar15 + auVar29._16_4_;
      fVar145 = fVar18 + auVar29._20_4_;
      fVar147 = fVar21 + auVar29._24_4_;
      fVar91 = auVar29._28_4_;
      fVar149 = fVar10 + auVar30._0_4_;
      fVar151 = fVar13 + auVar30._4_4_;
      fVar153 = fVar107 + auVar30._8_4_;
      fVar155 = fVar112 + auVar30._12_4_;
      fVar161 = fVar16 + auVar30._16_4_;
      fVar162 = fVar19 + auVar30._20_4_;
      fVar163 = fVar22 + auVar30._24_4_;
      fVar92 = auVar30._28_4_;
      fVar195 = auVar35._0_4_;
      fVar198 = auVar35._4_4_;
      auVar40._4_4_ = fVar198 * fVar94;
      auVar40._0_4_ = fVar195 * fVar93;
      fVar199 = auVar35._8_4_;
      auVar40._8_4_ = fVar199 * fVar95;
      fVar200 = auVar35._12_4_;
      auVar40._12_4_ = fVar200 * fVar139;
      fVar201 = auVar35._16_4_;
      auVar40._16_4_ = fVar201 * fVar143;
      fVar202 = auVar35._20_4_;
      auVar40._20_4_ = fVar202 * fVar145;
      fVar203 = auVar35._24_4_;
      auVar40._24_4_ = fVar203 * fVar147;
      auVar40._28_4_ = auVar34._28_4_;
      fVar140 = local_1060._0_4_;
      fVar144 = local_1060._4_4_;
      auVar41._4_4_ = fVar144 * fVar151;
      auVar41._0_4_ = fVar140 * fVar149;
      fVar146 = local_1060._8_4_;
      auVar41._8_4_ = fVar146 * fVar153;
      fVar148 = local_1060._12_4_;
      auVar41._12_4_ = fVar148 * fVar155;
      fVar150 = local_1060._16_4_;
      auVar41._16_4_ = fVar150 * fVar161;
      fVar152 = local_1060._20_4_;
      auVar41._20_4_ = fVar152 * fVar162;
      fVar154 = local_1060._24_4_;
      auVar41._24_4_ = fVar154 * fVar163;
      auVar41._28_4_ = fVar156;
      auVar34 = vsubps_avx(auVar41,auVar40);
      auVar35 = vsubps_avx(auVar86,auVar28);
      fVar206 = auVar35._0_4_;
      fVar208 = auVar35._4_4_;
      auVar42._4_4_ = fVar208 * fVar151;
      auVar42._0_4_ = fVar206 * fVar149;
      fVar209 = auVar35._8_4_;
      auVar42._8_4_ = fVar209 * fVar153;
      fVar210 = auVar35._12_4_;
      auVar42._12_4_ = fVar210 * fVar155;
      fVar211 = auVar35._16_4_;
      auVar42._16_4_ = fVar211 * fVar161;
      fVar212 = auVar35._20_4_;
      auVar42._20_4_ = fVar212 * fVar162;
      fVar213 = auVar35._24_4_;
      auVar42._24_4_ = fVar213 * fVar163;
      auVar42._28_4_ = fVar156 + fVar92;
      fVar156 = auVar28._0_4_ + fVar11;
      fVar149 = auVar28._4_4_ + fVar105;
      fVar151 = auVar28._8_4_ + fVar108;
      fVar153 = auVar28._12_4_ + fVar14;
      fVar155 = auVar28._16_4_ + fVar17;
      fVar161 = auVar28._20_4_ + fVar20;
      fVar162 = auVar28._24_4_ + fVar23;
      fVar194 = auVar28._28_4_;
      auVar43._4_4_ = fVar149 * fVar198;
      auVar43._0_4_ = fVar156 * fVar195;
      auVar43._8_4_ = fVar151 * fVar199;
      auVar43._12_4_ = fVar153 * fVar200;
      auVar43._16_4_ = fVar155 * fVar201;
      auVar43._20_4_ = fVar161 * fVar202;
      auVar43._24_4_ = fVar162 * fVar203;
      auVar43._28_4_ = fVar194;
      auVar35 = vsubps_avx(auVar43,auVar42);
      auVar44._4_4_ = fVar149 * fVar144;
      auVar44._0_4_ = fVar156 * fVar140;
      auVar44._8_4_ = fVar151 * fVar146;
      auVar44._12_4_ = fVar153 * fVar148;
      auVar44._16_4_ = fVar155 * fVar150;
      auVar44._20_4_ = fVar161 * fVar152;
      auVar44._24_4_ = fVar162 * fVar154;
      auVar44._28_4_ = fVar194 + auVar86._28_4_;
      auVar45._4_4_ = fVar208 * fVar94;
      auVar45._0_4_ = fVar206 * fVar93;
      auVar45._8_4_ = fVar209 * fVar95;
      auVar45._12_4_ = fVar210 * fVar139;
      auVar45._16_4_ = fVar211 * fVar143;
      auVar45._20_4_ = fVar212 * fVar145;
      auVar45._24_4_ = fVar213 * fVar147;
      auVar45._28_4_ = auVar117._28_4_ + fVar91;
      auVar86 = vsubps_avx(auVar45,auVar44);
      local_10a0._0_4_ =
           fStack_1458 * auVar34._0_4_ + auVar86._0_4_ * fVar90 + fVar84 * auVar35._0_4_;
      local_10a0._4_4_ =
           fStack_1458 * auVar34._4_4_ + auVar86._4_4_ * fVar90 + fVar84 * auVar35._4_4_;
      local_10a0._8_4_ =
           fStack_1458 * auVar34._8_4_ + auVar86._8_4_ * fVar90 + fVar84 * auVar35._8_4_;
      local_10a0._12_4_ =
           fStack_1458 * auVar34._12_4_ + auVar86._12_4_ * fVar90 + fVar84 * auVar35._12_4_;
      local_10a0._16_4_ =
           fStack_1458 * auVar34._16_4_ + auVar86._16_4_ * fVar90 + fVar84 * auVar35._16_4_;
      local_10a0._20_4_ =
           fStack_1458 * auVar34._20_4_ + auVar86._20_4_ * fVar90 + fVar84 * auVar35._20_4_;
      local_10a0._24_4_ =
           fStack_1458 * auVar34._24_4_ + auVar86._24_4_ * fVar90 + fVar84 * auVar35._24_4_;
      local_10a0._28_4_ = auVar35._28_4_ + auVar86._28_4_ + auVar35._28_4_;
      auVar34 = vsubps_avx(auVar28,auVar31);
      fVar162 = auVar28._0_4_ + auVar31._0_4_;
      fVar163 = auVar28._4_4_ + auVar31._4_4_;
      fVar164 = auVar28._8_4_ + auVar31._8_4_;
      fVar165 = auVar28._12_4_ + auVar31._12_4_;
      fVar166 = auVar28._16_4_ + auVar31._16_4_;
      fVar109 = auVar28._20_4_ + auVar31._20_4_;
      fVar111 = auVar28._24_4_ + auVar31._24_4_;
      auVar35 = vsubps_avx(auVar29,auVar32);
      fVar113 = auVar29._0_4_ + auVar32._0_4_;
      fVar119 = auVar29._4_4_ + auVar32._4_4_;
      fVar120 = auVar29._8_4_ + auVar32._8_4_;
      fVar121 = auVar29._12_4_ + auVar32._12_4_;
      fVar122 = auVar29._16_4_ + auVar32._16_4_;
      fVar123 = auVar29._20_4_ + auVar32._20_4_;
      fVar124 = auVar29._24_4_ + auVar32._24_4_;
      fVar125 = fVar91 + auVar32._28_4_;
      auVar86 = vsubps_avx(auVar30,auVar33);
      fVar149 = auVar33._0_4_ + auVar30._0_4_;
      fVar151 = auVar33._4_4_ + auVar30._4_4_;
      fVar153 = auVar33._8_4_ + auVar30._8_4_;
      fVar155 = auVar33._12_4_ + auVar30._12_4_;
      fVar161 = auVar33._16_4_ + auVar30._16_4_;
      fVar128 = auVar33._20_4_ + auVar30._20_4_;
      fVar129 = auVar33._24_4_ + auVar30._24_4_;
      fVar179 = auVar86._0_4_;
      fVar183 = auVar86._4_4_;
      auVar28._4_4_ = fVar183 * fVar119;
      auVar28._0_4_ = fVar179 * fVar113;
      fVar185 = auVar86._8_4_;
      auVar28._8_4_ = fVar185 * fVar120;
      fVar187 = auVar86._12_4_;
      auVar28._12_4_ = fVar187 * fVar121;
      fVar189 = auVar86._16_4_;
      auVar28._16_4_ = fVar189 * fVar122;
      fVar191 = auVar86._20_4_;
      auVar28._20_4_ = fVar191 * fVar123;
      fVar193 = auVar86._24_4_;
      auVar28._24_4_ = fVar193 * fVar124;
      auVar28._28_4_ = fVar91;
      fVar156 = auVar35._0_4_;
      fVar91 = auVar35._4_4_;
      auVar29._4_4_ = fVar91 * fVar151;
      auVar29._0_4_ = fVar156 * fVar149;
      fVar93 = auVar35._8_4_;
      auVar29._8_4_ = fVar93 * fVar153;
      fVar94 = auVar35._12_4_;
      auVar29._12_4_ = fVar94 * fVar155;
      fVar95 = auVar35._16_4_;
      auVar29._16_4_ = fVar95 * fVar161;
      fVar139 = auVar35._20_4_;
      auVar29._20_4_ = fVar139 * fVar128;
      fVar143 = auVar35._24_4_;
      auVar29._24_4_ = fVar143 * fVar129;
      auVar29._28_4_ = fVar92;
      auVar86 = vsubps_avx(auVar29,auVar28);
      fVar145 = auVar34._0_4_;
      fVar147 = auVar34._4_4_;
      auVar30._4_4_ = fVar147 * fVar151;
      auVar30._0_4_ = fVar145 * fVar149;
      fVar149 = auVar34._8_4_;
      auVar30._8_4_ = fVar149 * fVar153;
      fVar151 = auVar34._12_4_;
      auVar30._12_4_ = fVar151 * fVar155;
      fVar153 = auVar34._16_4_;
      auVar30._16_4_ = fVar153 * fVar161;
      fVar155 = auVar34._20_4_;
      auVar30._20_4_ = fVar155 * fVar128;
      fVar161 = auVar34._24_4_;
      auVar30._24_4_ = fVar161 * fVar129;
      auVar30._28_4_ = auVar33._28_4_ + fVar92;
      auVar32._4_4_ = fVar183 * fVar163;
      auVar32._0_4_ = fVar179 * fVar162;
      auVar32._8_4_ = fVar185 * fVar164;
      auVar32._12_4_ = fVar187 * fVar165;
      auVar32._16_4_ = fVar189 * fVar166;
      auVar32._20_4_ = fVar191 * fVar109;
      auVar32._24_4_ = fVar193 * fVar111;
      auVar32._28_4_ = fVar92;
      auVar117 = vsubps_avx(auVar32,auVar30);
      auVar33._4_4_ = fVar163 * fVar91;
      auVar33._0_4_ = fVar162 * fVar156;
      auVar33._8_4_ = fVar164 * fVar93;
      auVar33._12_4_ = fVar165 * fVar94;
      auVar33._16_4_ = fVar166 * fVar95;
      auVar33._20_4_ = fVar109 * fVar139;
      auVar33._24_4_ = fVar111 * fVar143;
      auVar33._28_4_ = fVar194 + auVar31._28_4_;
      auVar31._4_4_ = fVar147 * fVar119;
      auVar31._0_4_ = fVar145 * fVar113;
      auVar31._8_4_ = fVar149 * fVar120;
      auVar31._12_4_ = fVar151 * fVar121;
      auVar31._16_4_ = fVar153 * fVar122;
      auVar31._20_4_ = fVar155 * fVar123;
      auVar31._24_4_ = fVar161 * fVar124;
      auVar31._28_4_ = fVar125;
      auVar28 = vsubps_avx(auVar31,auVar33);
      auVar101._0_4_ =
           fStack_1458 * auVar86._0_4_ + auVar28._0_4_ * fVar90 + fVar84 * auVar117._0_4_;
      auVar101._4_4_ =
           fStack_1458 * auVar86._4_4_ + auVar28._4_4_ * fVar90 + fVar84 * auVar117._4_4_;
      auVar101._8_4_ =
           fStack_1458 * auVar86._8_4_ + auVar28._8_4_ * fVar90 + fVar84 * auVar117._8_4_;
      auVar101._12_4_ =
           fStack_1458 * auVar86._12_4_ + auVar28._12_4_ * fVar90 + fVar84 * auVar117._12_4_;
      auVar101._16_4_ =
           fStack_1458 * auVar86._16_4_ + auVar28._16_4_ * fVar90 + fVar84 * auVar117._16_4_;
      auVar101._20_4_ =
           fStack_1458 * auVar86._20_4_ + auVar28._20_4_ * fVar90 + fVar84 * auVar117._20_4_;
      auVar101._24_4_ =
           fStack_1458 * auVar86._24_4_ + auVar28._24_4_ * fVar90 + fVar84 * auVar117._24_4_;
      auVar101._28_4_ = fVar125 + auVar28._28_4_ + fVar125;
      local_10c0._0_4_ = auVar101._0_4_ + local_1080._0_4_ + local_10a0._0_4_;
      local_10c0._4_4_ = auVar101._4_4_ + local_1080._4_4_ + local_10a0._4_4_;
      local_10c0._8_4_ = auVar101._8_4_ + local_1080._8_4_ + local_10a0._8_4_;
      local_10c0._12_4_ = auVar101._12_4_ + local_1080._12_4_ + local_10a0._12_4_;
      local_10c0._16_4_ = auVar101._16_4_ + local_1080._16_4_ + local_10a0._16_4_;
      local_10c0._20_4_ = auVar101._20_4_ + local_1080._20_4_ + local_10a0._20_4_;
      local_10c0._24_4_ = auVar101._24_4_ + local_1080._24_4_ + local_10a0._24_4_;
      local_10c0._28_4_ = auVar101._28_4_ + local_1080._28_4_ + local_10a0._28_4_;
      auVar86 = vminps_avx(local_1080,local_10a0);
      auVar86 = vminps_avx(auVar86,auVar101);
      auVar126._8_4_ = 0x7fffffff;
      auVar126._0_8_ = 0x7fffffff7fffffff;
      auVar126._12_4_ = 0x7fffffff;
      auVar126._16_4_ = 0x7fffffff;
      auVar126._20_4_ = 0x7fffffff;
      auVar126._24_4_ = 0x7fffffff;
      auVar126._28_4_ = 0x7fffffff;
      local_10e0 = vandps_avx(local_10c0,auVar126);
      fVar162 = local_10e0._0_4_ * 1.1920929e-07;
      fVar163 = local_10e0._4_4_ * 1.1920929e-07;
      auVar46._4_4_ = fVar163;
      auVar46._0_4_ = fVar162;
      fVar164 = local_10e0._8_4_ * 1.1920929e-07;
      auVar46._8_4_ = fVar164;
      fVar165 = local_10e0._12_4_ * 1.1920929e-07;
      auVar46._12_4_ = fVar165;
      fVar166 = local_10e0._16_4_ * 1.1920929e-07;
      auVar46._16_4_ = fVar166;
      fVar109 = local_10e0._20_4_ * 1.1920929e-07;
      auVar46._20_4_ = fVar109;
      fVar111 = local_10e0._24_4_ * 1.1920929e-07;
      auVar46._24_4_ = fVar111;
      auVar46._28_4_ = 0x34000000;
      auVar135._0_8_ = CONCAT44(fVar163,fVar162) ^ 0x8000000080000000;
      auVar135._8_4_ = -fVar164;
      auVar135._12_4_ = -fVar165;
      auVar135._16_4_ = -fVar166;
      auVar135._20_4_ = -fVar109;
      auVar135._24_4_ = -fVar111;
      auVar135._28_4_ = 0xb4000000;
      auVar86 = vcmpps_avx(auVar86,auVar135,5);
      auVar28 = vmaxps_avx(local_1080,local_10a0);
      auVar117 = vmaxps_avx(auVar28,auVar101);
      auVar117 = vcmpps_avx(auVar117,auVar46,2);
      auVar117 = vorps_avx(auVar86,auVar117);
      if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar117 >> 0x7f,0) != '\0') ||
            (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar117 >> 0xbf,0) != '\0') ||
          (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar117[0x1f] < '\0') {
        auVar47._4_4_ = fVar144 * fVar25;
        auVar47._0_4_ = fVar140 * fVar24;
        auVar47._8_4_ = fVar146 * fVar26;
        auVar47._12_4_ = fVar148 * fVar27;
        auVar47._16_4_ = fVar150 * fVar75;
        auVar47._20_4_ = fVar152 * fVar82;
        auVar47._24_4_ = fVar154 * fVar83;
        auVar47._28_4_ = auVar86._28_4_;
        auVar48._4_4_ = fVar182 * fVar198;
        auVar48._0_4_ = fVar178 * fVar195;
        auVar48._8_4_ = fVar184 * fVar199;
        auVar48._12_4_ = fVar186 * fVar200;
        auVar48._16_4_ = fVar188 * fVar201;
        auVar48._20_4_ = fVar190 * fVar202;
        auVar48._24_4_ = fVar192 * fVar203;
        auVar48._28_4_ = 0x34000000;
        auVar29 = vsubps_avx(auVar48,auVar47);
        auVar49._4_4_ = fVar198 * fVar91;
        auVar49._0_4_ = fVar195 * fVar156;
        auVar49._8_4_ = fVar199 * fVar93;
        auVar49._12_4_ = fVar200 * fVar94;
        auVar49._16_4_ = fVar201 * fVar95;
        auVar49._20_4_ = fVar202 * fVar139;
        auVar49._24_4_ = fVar203 * fVar143;
        auVar49._28_4_ = auVar28._28_4_;
        auVar50._4_4_ = fVar144 * fVar183;
        auVar50._0_4_ = fVar140 * fVar179;
        auVar50._8_4_ = fVar146 * fVar185;
        auVar50._12_4_ = fVar148 * fVar187;
        auVar50._16_4_ = fVar150 * fVar189;
        auVar50._20_4_ = fVar152 * fVar191;
        auVar50._24_4_ = fVar154 * fVar193;
        auVar50._28_4_ = fVar92;
        auVar30 = vsubps_avx(auVar50,auVar49);
        auVar158._8_4_ = 0x7fffffff;
        auVar158._0_8_ = 0x7fffffff7fffffff;
        auVar158._12_4_ = 0x7fffffff;
        auVar158._16_4_ = 0x7fffffff;
        auVar158._20_4_ = 0x7fffffff;
        auVar158._24_4_ = 0x7fffffff;
        auVar158._28_4_ = 0x7fffffff;
        auVar86 = vandps_avx(auVar158,auVar47);
        auVar28 = vandps_avx(auVar158,auVar49);
        auVar86 = vcmpps_avx(auVar86,auVar28,1);
        local_1280 = vblendvps_avx(auVar30,auVar29,auVar86);
        auVar51._4_4_ = fVar208 * fVar183;
        auVar51._0_4_ = fVar206 * fVar179;
        auVar51._8_4_ = fVar209 * fVar185;
        auVar51._12_4_ = fVar210 * fVar187;
        auVar51._16_4_ = fVar211 * fVar189;
        auVar51._20_4_ = fVar212 * fVar191;
        auVar51._24_4_ = fVar213 * fVar193;
        auVar51._28_4_ = auVar86._28_4_;
        auVar52._4_4_ = fVar208 * fVar25;
        auVar52._0_4_ = fVar206 * fVar24;
        auVar52._8_4_ = fVar209 * fVar26;
        auVar52._12_4_ = fVar210 * fVar27;
        auVar52._16_4_ = fVar211 * fVar75;
        auVar52._20_4_ = fVar212 * fVar82;
        auVar52._24_4_ = fVar213 * fVar83;
        auVar52._28_4_ = auVar29._28_4_;
        auVar53._4_4_ = fVar198 * fVar172;
        auVar53._0_4_ = fVar195 * fVar169;
        auVar53._8_4_ = fVar199 * fVar173;
        auVar53._12_4_ = fVar200 * fVar174;
        auVar53._16_4_ = fVar201 * fVar175;
        auVar53._20_4_ = fVar202 * fVar176;
        auVar53._24_4_ = fVar203 * fVar177;
        auVar53._28_4_ = local_1040._28_4_;
        auVar29 = vsubps_avx(auVar52,auVar53);
        auVar54._4_4_ = fVar198 * fVar147;
        auVar54._0_4_ = fVar195 * fVar145;
        auVar54._8_4_ = fVar199 * fVar149;
        auVar54._12_4_ = fVar200 * fVar151;
        auVar54._16_4_ = fVar201 * fVar153;
        auVar54._20_4_ = fVar202 * fVar155;
        auVar54._24_4_ = fVar203 * fVar161;
        auVar54._28_4_ = auVar28._28_4_;
        auVar30 = vsubps_avx(auVar54,auVar51);
        auVar86 = vandps_avx(auVar158,auVar53);
        auVar28 = vandps_avx(auVar158,auVar51);
        auVar86 = vcmpps_avx(auVar86,auVar28,1);
        local_1260 = vblendvps_avx(auVar30,auVar29,auVar86);
        auVar55._4_4_ = fVar144 * fVar147;
        auVar55._0_4_ = fVar140 * fVar145;
        auVar55._8_4_ = fVar146 * fVar149;
        auVar55._12_4_ = fVar148 * fVar151;
        auVar55._16_4_ = fVar150 * fVar153;
        auVar55._20_4_ = fVar152 * fVar155;
        auVar55._24_4_ = fVar154 * fVar161;
        auVar55._28_4_ = auVar34._28_4_;
        auVar56._4_4_ = fVar144 * fVar172;
        auVar56._0_4_ = fVar140 * fVar169;
        auVar56._8_4_ = fVar146 * fVar173;
        auVar56._12_4_ = fVar148 * fVar174;
        auVar56._16_4_ = fVar150 * fVar175;
        auVar56._20_4_ = fVar152 * fVar176;
        auVar56._24_4_ = fVar154 * fVar177;
        auVar56._28_4_ = auVar86._28_4_;
        auVar57._4_4_ = fVar208 * fVar182;
        auVar57._0_4_ = fVar206 * fVar178;
        auVar57._8_4_ = fVar209 * fVar184;
        auVar57._12_4_ = fVar210 * fVar186;
        auVar57._16_4_ = fVar211 * fVar188;
        auVar57._20_4_ = fVar212 * fVar190;
        auVar57._24_4_ = fVar213 * fVar192;
        auVar57._28_4_ = auVar29._28_4_;
        auVar58._4_4_ = fVar208 * fVar91;
        auVar58._0_4_ = fVar206 * fVar156;
        auVar58._8_4_ = fVar209 * fVar93;
        auVar58._12_4_ = fVar210 * fVar94;
        auVar58._16_4_ = fVar211 * fVar95;
        auVar58._20_4_ = fVar212 * fVar139;
        auVar58._24_4_ = fVar213 * fVar143;
        auVar58._28_4_ = auVar35._28_4_;
        auVar29 = vsubps_avx(auVar56,auVar57);
        auVar30 = vsubps_avx(auVar58,auVar55);
        auVar86 = vandps_avx(auVar158,auVar57);
        auVar28 = vandps_avx(auVar158,auVar55);
        auVar28 = vcmpps_avx(auVar86,auVar28,1);
        local_1240 = vblendvps_avx(auVar30,auVar29,auVar28);
        auVar76 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
        fVar139 = local_1240._0_4_;
        fVar143 = local_1240._4_4_;
        fVar145 = local_1240._8_4_;
        fVar147 = local_1240._12_4_;
        fVar149 = local_1240._16_4_;
        fVar151 = local_1240._20_4_;
        fVar153 = local_1240._24_4_;
        fVar155 = local_1260._0_4_;
        fVar161 = local_1260._4_4_;
        fVar162 = local_1260._8_4_;
        fVar163 = local_1260._12_4_;
        fVar164 = local_1260._16_4_;
        fVar165 = local_1260._20_4_;
        fVar166 = local_1260._24_4_;
        fVar156 = local_1280._0_4_;
        fVar91 = local_1280._4_4_;
        fVar92 = local_1280._8_4_;
        fVar24 = local_1280._12_4_;
        fVar25 = local_1280._16_4_;
        fVar26 = local_1280._20_4_;
        fVar27 = local_1280._24_4_;
        fVar75 = fStack_1458 * fVar156 + fVar139 * fVar90 + fVar155 * fVar84;
        fVar82 = fStack_1458 * fVar91 + fVar143 * fVar90 + fVar161 * fVar84;
        fVar83 = fStack_1458 * fVar92 + fVar145 * fVar90 + fVar162 * fVar84;
        fVar93 = fStack_1458 * fVar24 + fVar147 * fVar90 + fVar163 * fVar84;
        fVar94 = fStack_1458 * fVar25 + fVar149 * fVar90 + fVar164 * fVar84;
        fVar95 = fStack_1458 * fVar26 + fVar151 * fVar90 + fVar165 * fVar84;
        fVar84 = fStack_1458 * fVar27 + fVar153 * fVar90 + fVar166 * fVar84;
        fVar90 = auVar117._28_4_ + auVar117._28_4_ + 0.0;
        auVar79._0_4_ = fVar75 + fVar75;
        auVar79._4_4_ = fVar82 + fVar82;
        auVar79._8_4_ = fVar83 + fVar83;
        auVar79._12_4_ = fVar93 + fVar93;
        auVar79._16_4_ = fVar94 + fVar94;
        auVar79._20_4_ = fVar95 + fVar95;
        auVar79._24_4_ = fVar84 + fVar84;
        auVar79._28_4_ = fVar90 + fVar90;
        fVar75 = fVar156 * fVar11 + fVar139 * fVar10 + fVar155 * fVar3;
        fVar105 = fVar91 * fVar105 + fVar143 * fVar13 + fVar161 * fVar12;
        fVar106 = fVar92 * fVar108 + fVar145 * fVar107 + fVar162 * fVar106;
        fVar107 = fVar24 * fVar14 + fVar147 * fVar112 + fVar163 * fVar110;
        fVar108 = fVar25 * fVar17 + fVar149 * fVar16 + fVar164 * fVar15;
        fVar110 = fVar26 * fVar20 + fVar151 * fVar19 + fVar165 * fVar18;
        fVar112 = fVar27 * fVar23 + fVar153 * fVar22 + fVar166 * fVar21;
        auVar117 = vrcpps_avx(auVar79);
        fVar84 = auVar117._0_4_;
        fVar90 = auVar117._4_4_;
        auVar59._4_4_ = auVar79._4_4_ * fVar90;
        auVar59._0_4_ = auVar79._0_4_ * fVar84;
        fVar3 = auVar117._8_4_;
        auVar59._8_4_ = auVar79._8_4_ * fVar3;
        fVar10 = auVar117._12_4_;
        auVar59._12_4_ = auVar79._12_4_ * fVar10;
        fVar11 = auVar117._16_4_;
        auVar59._16_4_ = auVar79._16_4_ * fVar11;
        fVar12 = auVar117._20_4_;
        auVar59._20_4_ = auVar79._20_4_ * fVar12;
        fVar13 = auVar117._24_4_;
        auVar59._24_4_ = auVar79._24_4_ * fVar13;
        auVar59._28_4_ = auVar86._28_4_;
        auVar132._8_4_ = 0x3f800000;
        auVar132._0_8_ = 0x3f8000003f800000;
        auVar132._12_4_ = 0x3f800000;
        auVar132._16_4_ = 0x3f800000;
        auVar132._20_4_ = 0x3f800000;
        auVar132._24_4_ = 0x3f800000;
        auVar132._28_4_ = 0x3f800000;
        auVar86 = vsubps_avx(auVar132,auVar59);
        local_11c0._4_4_ = (fVar105 + fVar105) * (fVar90 + fVar90 * auVar86._4_4_);
        local_11c0._0_4_ = (fVar75 + fVar75) * (fVar84 + fVar84 * auVar86._0_4_);
        local_11c0._8_4_ = (fVar106 + fVar106) * (fVar3 + fVar3 * auVar86._8_4_);
        local_11c0._12_4_ = (fVar107 + fVar107) * (fVar10 + fVar10 * auVar86._12_4_);
        local_11c0._16_4_ = (fVar108 + fVar108) * (fVar11 + fVar11 * auVar86._16_4_);
        local_11c0._20_4_ = (fVar110 + fVar110) * (fVar12 + fVar12 * auVar86._20_4_);
        local_11c0._24_4_ = (fVar112 + fVar112) * (fVar13 + fVar13 * auVar86._24_4_);
        local_11c0._28_4_ = local_1020._28_4_;
        auVar81 = ZEXT3264(local_11c0);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar102._4_4_ = uVar2;
        auVar102._0_4_ = uVar2;
        auVar102._8_4_ = uVar2;
        auVar102._12_4_ = uVar2;
        auVar102._16_4_ = uVar2;
        auVar102._20_4_ = uVar2;
        auVar102._24_4_ = uVar2;
        auVar102._28_4_ = uVar2;
        auVar86 = vcmpps_avx(auVar102,local_11c0,2);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar196._4_4_ = uVar2;
        auVar196._0_4_ = uVar2;
        auVar196._8_4_ = uVar2;
        auVar196._12_4_ = uVar2;
        auVar196._16_4_ = uVar2;
        auVar196._20_4_ = uVar2;
        auVar196._24_4_ = uVar2;
        auVar196._28_4_ = uVar2;
        auVar136 = ZEXT3264(auVar196);
        auVar117 = vcmpps_avx(local_11c0,auVar196,2);
        auVar86 = vandps_avx(auVar117,auVar86);
        auVar85 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
        auVar76 = vpand_avx(auVar85,auVar76);
        auVar85 = vpmovsxwd_avx(auVar76);
        auVar96 = vpshufd_avx(auVar76,0xee);
        auVar96 = vpmovsxwd_avx(auVar96);
        auVar103._16_16_ = auVar96;
        auVar103._0_16_ = auVar85;
        if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar103 >> 0x7f,0) != '\0') ||
              (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar96 >> 0x3f,0) != '\0') ||
            (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar96[0xf] < '\0') {
          auVar86 = vcmpps_avx(auVar79,_DAT_01f7b000,4);
          auVar85 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
          auVar76 = vpand_avx(auVar76,auVar85);
          auVar85 = vpmovsxwd_avx(auVar76);
          auVar96 = vpunpckhwd_avx(auVar76,auVar76);
          local_14e0._16_16_ = auVar96;
          local_14e0._0_16_ = auVar85;
          if ((((((((local_14e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_14e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_14e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_14e0 >> 0x7f,0) != '\0') ||
                (local_14e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar96 >> 0x3f,0) != '\0') ||
              (local_14e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar96[0xf] < '\0') {
            local_12e0 = local_1080;
            local_12c0 = local_10a0;
            local_12a0 = local_10c0;
            auVar86 = vrcpps_avx(local_10c0);
            fVar84 = auVar86._0_4_;
            fVar90 = auVar86._4_4_;
            auVar60._4_4_ = local_10c0._4_4_ * fVar90;
            auVar60._0_4_ = local_10c0._0_4_ * fVar84;
            fVar3 = auVar86._8_4_;
            auVar60._8_4_ = local_10c0._8_4_ * fVar3;
            fVar10 = auVar86._12_4_;
            auVar60._12_4_ = local_10c0._12_4_ * fVar10;
            fVar11 = auVar86._16_4_;
            auVar60._16_4_ = local_10c0._16_4_ * fVar11;
            fVar12 = auVar86._20_4_;
            auVar60._20_4_ = local_10c0._20_4_ * fVar12;
            fVar13 = auVar86._24_4_;
            auVar60._24_4_ = local_10c0._24_4_ * fVar13;
            auVar60._28_4_ = local_10c0._28_4_;
            auVar159._8_4_ = 0x3f800000;
            auVar159._0_8_ = 0x3f8000003f800000;
            auVar159._12_4_ = 0x3f800000;
            auVar159._16_4_ = 0x3f800000;
            auVar159._20_4_ = 0x3f800000;
            auVar159._24_4_ = 0x3f800000;
            auVar159._28_4_ = 0x3f800000;
            auVar117 = vsubps_avx(auVar159,auVar60);
            auVar127._0_4_ = fVar84 + fVar84 * auVar117._0_4_;
            auVar127._4_4_ = fVar90 + fVar90 * auVar117._4_4_;
            auVar127._8_4_ = fVar3 + fVar3 * auVar117._8_4_;
            auVar127._12_4_ = fVar10 + fVar10 * auVar117._12_4_;
            auVar127._16_4_ = fVar11 + fVar11 * auVar117._16_4_;
            auVar127._20_4_ = fVar12 + fVar12 * auVar117._20_4_;
            auVar127._24_4_ = fVar13 + fVar13 * auVar117._24_4_;
            auVar127._28_4_ = auVar86._28_4_ + auVar117._28_4_;
            auVar133._8_4_ = 0x219392ef;
            auVar133._0_8_ = 0x219392ef219392ef;
            auVar133._12_4_ = 0x219392ef;
            auVar133._16_4_ = 0x219392ef;
            auVar133._20_4_ = 0x219392ef;
            auVar133._24_4_ = 0x219392ef;
            auVar133._28_4_ = 0x219392ef;
            auVar117 = vcmpps_avx(local_10e0,auVar133,5);
            auVar86 = vandps_avx(auVar117,auVar127);
            local_1220 = local_14e0;
            local_1140 = local_1100;
            pSVar67 = context->scene;
            auVar61._4_4_ = local_1080._4_4_ * auVar86._4_4_;
            auVar61._0_4_ = local_1080._0_4_ * auVar86._0_4_;
            auVar61._8_4_ = local_1080._8_4_ * auVar86._8_4_;
            auVar61._12_4_ = local_1080._12_4_ * auVar86._12_4_;
            auVar61._16_4_ = local_1080._16_4_ * auVar86._16_4_;
            auVar61._20_4_ = local_1080._20_4_ * auVar86._20_4_;
            auVar61._24_4_ = local_1080._24_4_ * auVar86._24_4_;
            auVar61._28_4_ = auVar117._28_4_;
            auVar117 = vminps_avx(auVar61,auVar159);
            auVar62._4_4_ = local_10a0._4_4_ * auVar86._4_4_;
            auVar62._0_4_ = local_10a0._0_4_ * auVar86._0_4_;
            auVar62._8_4_ = local_10a0._8_4_ * auVar86._8_4_;
            auVar62._12_4_ = local_10a0._12_4_ * auVar86._12_4_;
            auVar62._16_4_ = local_10a0._16_4_ * auVar86._16_4_;
            auVar62._20_4_ = local_10a0._20_4_ * auVar86._20_4_;
            auVar62._24_4_ = local_10a0._24_4_ * auVar86._24_4_;
            auVar62._28_4_ = auVar86._28_4_;
            auVar86 = vminps_avx(auVar62,auVar159);
            auVar28 = vsubps_avx(auVar159,auVar117);
            local_11e0 = vblendvps_avx(auVar86,auVar28,local_1100);
            auVar86 = vsubps_avx(auVar159,auVar86);
            local_1200 = vblendvps_avx(auVar117,auVar86,local_1100);
            fVar84 = local_1120._0_4_;
            fVar90 = local_1120._4_4_;
            fVar3 = local_1120._8_4_;
            fVar10 = local_1120._12_4_;
            fVar11 = local_1120._16_4_;
            fVar12 = local_1120._20_4_;
            fVar13 = local_1120._24_4_;
            uStack_1184 = local_1200._28_4_;
            local_11a0[0] = fVar156 * fVar84;
            local_11a0[1] = fVar91 * fVar90;
            local_11a0[2] = fVar92 * fVar3;
            local_11a0[3] = fVar24 * fVar10;
            fStack_1190 = fVar25 * fVar11;
            fStack_118c = fVar26 * fVar12;
            fStack_1188 = fVar27 * fVar13;
            local_1180[0] = fVar155 * fVar84;
            local_1180[1] = fVar161 * fVar90;
            local_1180[2] = fVar162 * fVar3;
            local_1180[3] = fVar163 * fVar10;
            fStack_1170 = fVar164 * fVar11;
            fStack_116c = fVar165 * fVar12;
            fStack_1168 = fVar166 * fVar13;
            uStack_1164 = uStack_1184;
            auVar104._16_16_ = auVar96;
            auVar104._0_16_ = auVar85;
            auVar118._8_4_ = 0x7f800000;
            auVar118._0_8_ = 0x7f8000007f800000;
            auVar118._12_4_ = 0x7f800000;
            auVar118._16_4_ = 0x7f800000;
            auVar118._20_4_ = 0x7f800000;
            auVar118._24_4_ = 0x7f800000;
            auVar118._28_4_ = 0x7f800000;
            auVar86 = vblendvps_avx(auVar118,local_11c0,auVar104);
            local_1160[0] = fVar84 * fVar139;
            local_1160[1] = fVar90 * fVar143;
            local_1160[2] = fVar3 * fVar145;
            local_1160[3] = fVar10 * fVar147;
            fStack_1150 = fVar11 * fVar149;
            fStack_114c = fVar12 * fVar151;
            fStack_1148 = fVar13 * fVar153;
            uStack_1144 = uStack_1184;
            auVar117 = vshufps_avx(auVar86,auVar86,0xb1);
            auVar117 = vminps_avx(auVar86,auVar117);
            auVar28 = vshufpd_avx(auVar117,auVar117,5);
            auVar117 = vminps_avx(auVar117,auVar28);
            auVar28 = vperm2f128_avx(auVar117,auVar117,1);
            auVar117 = vminps_avx(auVar117,auVar28);
            auVar86 = vcmpps_avx(auVar86,auVar117,0);
            auVar85 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
            auVar76 = vpand_avx(auVar85,auVar76);
            auVar85 = vpmovsxwd_avx(auVar76);
            auVar76 = vpunpckhwd_avx(auVar76,auVar76);
            auVar88._16_16_ = auVar76;
            auVar88._0_16_ = auVar85;
            if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar88 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar88 >> 0x7f,0) == '\0') &&
                  (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB161(auVar76 >> 0x3f,0) == '\0') &&
                (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar76[0xf]) {
              auVar88 = local_14e0;
            }
            uVar65 = vmovmskps_avx(auVar88);
            uVar64 = 0;
            if (uVar65 != 0) {
              for (; (uVar65 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
              }
            }
            auVar76 = vpcmpeqd_avx(local_11e0._0_16_,local_11e0._0_16_);
            auVar138 = ZEXT1664(auVar76);
            local_1460 = pSVar67;
            fStack_1454 = fStack_1458;
            fStack_1450 = fStack_1458;
            fStack_144c = fStack_1458;
            fStack_1448 = fStack_1458;
            fStack_1444 = fStack_1458;
            local_1040 = auVar78;
            local_1020 = auVar37;
LAB_00eff616:
            uVar73 = (ulong)uVar64;
            uVar64 = *(uint *)((long)&local_fc0 + uVar73 * 4);
            pGVar8 = (pSVar67->geometries).items[uVar64].ptr;
            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              *(undefined4 *)(local_14e0 + uVar73 * 4) = 0;
              pSVar67 = local_1460;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar2 = *(undefined4 *)(local_1200 + uVar73 * 4);
                uVar5 = *(undefined4 *)(local_11e0 + uVar73 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11c0 + uVar73 * 4);
                *(float *)(ray + k * 4 + 0xc0) = local_11a0[uVar73];
                *(float *)(ray + k * 4 + 0xd0) = local_1180[uVar73];
                *(float *)(ray + k * 4 + 0xe0) = local_1160[uVar73];
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar2;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar5;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&local_13a0 + uVar73 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar64;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_00effaa7;
              }
              uVar2 = *(undefined4 *)(local_1200 + uVar73 * 4);
              local_1340._4_4_ = uVar2;
              local_1340._0_4_ = uVar2;
              local_1340._8_4_ = uVar2;
              local_1340._12_4_ = uVar2;
              local_1330 = *(undefined4 *)(local_11e0 + uVar73 * 4);
              local_1310 = vpshufd_avx(ZEXT416(uVar64),0);
              uVar2 = *(undefined4 *)((long)&local_13a0 + uVar73 * 4);
              local_1320._4_4_ = uVar2;
              local_1320._0_4_ = uVar2;
              local_1320._8_4_ = uVar2;
              local_1320._12_4_ = uVar2;
              fVar84 = local_11a0[uVar73];
              fVar90 = local_1180[uVar73];
              local_1360._4_4_ = fVar90;
              local_1360._0_4_ = fVar90;
              local_1360._8_4_ = fVar90;
              local_1360._12_4_ = fVar90;
              fVar90 = local_1160[uVar73];
              local_1350._4_4_ = fVar90;
              local_1350._0_4_ = fVar90;
              local_1350._8_4_ = fVar90;
              local_1350._12_4_ = fVar90;
              local_1370[0] = (RTCHitN)SUB41(fVar84,0);
              local_1370[1] = (RTCHitN)(char)((uint)fVar84 >> 8);
              local_1370[2] = (RTCHitN)(char)((uint)fVar84 >> 0x10);
              local_1370[3] = (RTCHitN)(char)((uint)fVar84 >> 0x18);
              local_1370[4] = (RTCHitN)SUB41(fVar84,0);
              local_1370[5] = (RTCHitN)(char)((uint)fVar84 >> 8);
              local_1370[6] = (RTCHitN)(char)((uint)fVar84 >> 0x10);
              local_1370[7] = (RTCHitN)(char)((uint)fVar84 >> 0x18);
              local_1370[8] = (RTCHitN)SUB41(fVar84,0);
              local_1370[9] = (RTCHitN)(char)((uint)fVar84 >> 8);
              local_1370[10] = (RTCHitN)(char)((uint)fVar84 >> 0x10);
              local_1370[0xb] = (RTCHitN)(char)((uint)fVar84 >> 0x18);
              local_1370[0xc] = (RTCHitN)SUB41(fVar84,0);
              local_1370[0xd] = (RTCHitN)(char)((uint)fVar84 >> 8);
              local_1370[0xe] = (RTCHitN)(char)((uint)fVar84 >> 0x10);
              local_1370[0xf] = (RTCHitN)(char)((uint)fVar84 >> 0x18);
              uStack_132c = local_1330;
              uStack_1328 = local_1330;
              uStack_1324 = local_1330;
              vcmpps_avx(ZEXT1632(local_1340),ZEXT1632(local_1340),0xf);
              uStack_12fc = context->user->instID[0];
              local_1300 = uStack_12fc;
              uStack_12f8 = uStack_12fc;
              uStack_12f4 = uStack_12fc;
              uStack_12f0 = context->user->instPrimID[0];
              uStack_12ec = uStack_12f0;
              uStack_12e8 = uStack_12f0;
              uStack_12e4 = uStack_12f0;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11c0 + uVar73 * 4);
              local_1540 = *local_1528;
              local_1510.valid = (int *)local_1540;
              local_1510.geometryUserPtr = pGVar8->userPtr;
              local_1510.context = context->user;
              local_1510.hit = local_1370;
              local_1510.N = 4;
              local_1480 = auVar81._0_32_;
              local_14a0 = auVar136._0_32_;
              local_1510.ray = (RTCRayN *)ray;
              if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar76 = auVar138._0_16_;
                (*pGVar8->intersectionFilterN)(&local_1510);
                auVar136 = ZEXT3264(local_14a0);
                auVar81 = ZEXT3264(local_1480);
                auVar76 = vpcmpeqd_avx(auVar76,auVar76);
                auVar138 = ZEXT1664(auVar76);
              }
              auVar76 = auVar138._0_16_;
              if (local_1540 == (undefined1  [16])0x0) {
                auVar85 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar85 = auVar85 ^ auVar76;
              }
              else {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var9)(&local_1510);
                  auVar136 = ZEXT3264(local_14a0);
                  auVar81 = ZEXT3264(local_1480);
                  auVar76 = vpcmpeqd_avx(auVar76,auVar76);
                  auVar138 = ZEXT1664(auVar76);
                }
                auVar76 = vpcmpeqd_avx(local_1540,_DAT_01f45a50);
                auVar85 = auVar76 ^ auVar138._0_16_;
                if (local_1540 != (undefined1  [16])0x0) {
                  auVar76 = auVar76 ^ auVar138._0_16_;
                  auVar96 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])local_1510.hit);
                  *(undefined1 (*) [16])(local_1510.ray + 0xc0) = auVar96;
                  auVar96 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])(local_1510.hit + 0x10));
                  *(undefined1 (*) [16])(local_1510.ray + 0xd0) = auVar96;
                  auVar96 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])(local_1510.hit + 0x20));
                  *(undefined1 (*) [16])(local_1510.ray + 0xe0) = auVar96;
                  auVar96 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])(local_1510.hit + 0x30));
                  *(undefined1 (*) [16])(local_1510.ray + 0xf0) = auVar96;
                  auVar96 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])(local_1510.hit + 0x40));
                  *(undefined1 (*) [16])(local_1510.ray + 0x100) = auVar96;
                  auVar96 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])(local_1510.hit + 0x50));
                  *(undefined1 (*) [16])(local_1510.ray + 0x110) = auVar96;
                  auVar96 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])(local_1510.hit + 0x60));
                  *(undefined1 (*) [16])(local_1510.ray + 0x120) = auVar96;
                  auVar96 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])(local_1510.hit + 0x70));
                  *(undefined1 (*) [16])(local_1510.ray + 0x130) = auVar96;
                  auVar76 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])(local_1510.hit + 0x80));
                  *(undefined1 (*) [16])(local_1510.ray + 0x140) = auVar76;
                }
              }
              pSVar67 = local_1460;
              auVar77._8_8_ = 0x100000001;
              auVar77._0_8_ = 0x100000001;
              if ((auVar77 & auVar85) == (undefined1  [16])0x0) {
                *(int *)(ray + k * 4 + 0x80) = auVar136._0_4_;
              }
              else {
                auVar136 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
              }
              *(undefined4 *)(local_14e0 + uVar73 * 4) = 0;
              auVar76 = vshufps_avx(auVar136._0_16_,auVar136._0_16_,0);
              auVar80._16_16_ = auVar76;
              auVar80._0_16_ = auVar76;
              auVar86 = vcmpps_avx(auVar81._0_32_,auVar80,2);
              local_14e0 = vandps_avx(auVar86,local_14e0);
            }
            if ((((((((local_14e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_14e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_14e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_14e0 >> 0x7f,0) == '\0') &&
                  (local_14e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_14e0 >> 0xbf,0) == '\0') &&
                (local_14e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_14e0[0x1f]) goto LAB_00effaa7;
            auVar89._8_4_ = 0x7f800000;
            auVar89._0_8_ = 0x7f8000007f800000;
            auVar89._12_4_ = 0x7f800000;
            auVar89._16_4_ = 0x7f800000;
            auVar89._20_4_ = 0x7f800000;
            auVar89._24_4_ = 0x7f800000;
            auVar89._28_4_ = 0x7f800000;
            auVar86 = vblendvps_avx(auVar89,auVar81._0_32_,local_14e0);
            auVar117 = vshufps_avx(auVar86,auVar86,0xb1);
            auVar117 = vminps_avx(auVar86,auVar117);
            auVar28 = vshufpd_avx(auVar117,auVar117,5);
            auVar117 = vminps_avx(auVar117,auVar28);
            auVar28 = vperm2f128_avx(auVar117,auVar117,1);
            auVar117 = vminps_avx(auVar117,auVar28);
            auVar117 = vcmpps_avx(auVar86,auVar117,0);
            auVar28 = local_14e0 & auVar117;
            auVar86 = local_14e0;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0x7f,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0xbf,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar28[0x1f] < '\0') {
              auVar86 = vandps_avx(auVar117,local_14e0);
            }
            uVar65 = vmovmskps_avx(auVar86);
            uVar64 = 0;
            if (uVar65 != 0) {
              for (; (uVar65 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
              }
            }
            goto LAB_00eff616;
          }
        }
      }
LAB_00effaa7:
      auVar138 = ZEXT1664(local_13b0);
      auVar142 = ZEXT1664(local_13c0);
      auVar160 = ZEXT1664(local_13d0);
      auVar168 = ZEXT1664(local_13e0);
      auVar171 = ZEXT1664(local_13f0);
      auVar181 = ZEXT1664(local_1400);
      auVar197 = ZEXT1664(local_1410);
      auVar205 = ZEXT1664(local_1420);
      auVar207 = ZEXT1664(local_1430);
      auVar136 = ZEXT1664(local_14b0);
    }
    uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar81 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }